

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

Vec_Int_t * Cnf_DataCollectCiSatNums(Cnf_Dat_t *pCnf,Aig_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  pVVar3 = p->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(p_00,pCnf->pVarNums[*(int *)((long)pVVar3->pArray[lVar5] + 0x24)]);
      lVar5 = lVar5 + 1;
      pVVar3 = p->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cnf_DataCollectCiSatNums( Cnf_Dat_t * pCnf, Aig_Man_t * p )
{
    Vec_Int_t * vCiIds;
    Aig_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
    return vCiIds;
}